

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int set_array_length(JSContext *ctx,JSObject *p,JSValue val,int flags)

{
  uint uVar1;
  JSVarRef **ppJVar2;
  JSProperty *pJVar3;
  JSValue *pJVar4;
  int iVar5;
  int iVar6;
  BOOL BVar7;
  JSAtom JVar8;
  double dVar9;
  JSValueUnion JVar10;
  int64_t iVar11;
  JSValueUnion JVar12;
  JSShape *pJVar13;
  ulong uVar14;
  uint uVar15;
  JSShape *pJVar16;
  uint uVar17;
  uint32_t n;
  double dVar18;
  long lVar19;
  long lVar20;
  JSValue v;
  JSValue JVar21;
  uint32_t idx;
  uint32_t len;
  uint local_44;
  JSShape *local_40;
  uint local_38;
  uint local_34;
  
  iVar5 = JS_ToArrayLengthFree(ctx,&local_38,val,0);
  iVar6 = -1;
  if (iVar5 == 0) {
    if ((p->shape[1].header.ref_count & 0x8000000) == 0) {
      iVar5 = JS_ThrowTypeErrorReadOnly(ctx,flags,0x30);
      return iVar5;
    }
    if (((p->field_0).header.dummy1 & 8) == 0) {
      pJVar4 = (JSValue *)p->prop;
      JVar21 = *pJVar4;
      if (0xfffffff4 < (uint)pJVar4->tag) {
        *(int *)(pJVar4->u).ptr = *(pJVar4->u).ptr + 1;
      }
      JS_ToInt32Free(ctx,(int32_t *)&local_34,JVar21);
      uVar1 = local_38;
      if (local_38 < local_34) {
        pJVar13 = p->shape;
        uVar15 = pJVar13->prop_count;
        uVar17 = local_34;
        local_40 = pJVar13;
        if (uVar15 < local_34 - local_38) {
          if (0 < (int)uVar15) {
            pJVar16 = pJVar13 + 1;
            lVar19 = 0;
            do {
              JVar8 = *(JSAtom *)(&pJVar13[1].header.field_0x4 + lVar19 * 8);
              if ((((JVar8 != 0) &&
                   (BVar7 = JS_AtomIsArrayIndex(ctx,&local_44,JVar8), pJVar13 = local_40, BVar7 != 0
                   )) && (uVar1 <= local_44)) &&
                 ((*(byte *)((long)&local_40[1].header.ref_count + lVar19 * 8 + 3) & 4) == 0)) {
                uVar1 = local_44 + 1;
              }
              lVar19 = lVar19 + 1;
            } while (uVar15 != (uint)lVar19);
            lVar20 = 0x40;
            lVar19 = 0;
            do {
              JVar8 = *(JSAtom *)&(pJVar16->header).field_0x4;
              if (((JVar8 != 0) &&
                  (local_40 = pJVar13, BVar7 = JS_AtomIsArrayIndex(ctx,&local_44,JVar8),
                  pJVar13 = local_40, BVar7 != 0)) && (uVar1 <= local_44)) {
                delete_property(ctx,p,*(JSAtom *)&(pJVar16->header).field_0x4);
                pJVar16 = (JSShape *)((long)&(p->shape->header).ref_count + lVar20);
                pJVar13 = p->shape;
              }
              lVar19 = lVar19 + 1;
              pJVar16 = (JSShape *)&(pJVar16->header).link;
              lVar20 = lVar20 + 8;
            } while (lVar19 < pJVar13->prop_count);
          }
        }
        else {
          do {
            n = uVar17 - 1;
            JVar8 = JS_NewAtomUInt32(ctx,n);
            iVar5 = delete_property(ctx,p,JVar8);
            JS_FreeAtom(ctx,JVar8);
            uVar1 = uVar17;
            if (iVar5 == 0) break;
            uVar17 = n;
            uVar1 = local_38;
          } while (local_38 < n);
        }
      }
      JVar10._4_4_ = 0;
      JVar10.int32 = uVar1;
      JVar12.float64 = (double)JVar10.float64;
      if (-1 < (int)uVar1) {
        JVar12 = JVar10;
      }
      iVar11 = 7;
      if (-1 < (int)uVar1) {
        iVar11 = 0;
      }
      JVar21.tag = iVar11;
      JVar21.u.float64 = JVar12.float64;
      set_value(ctx,(JSValue *)p->prop,JVar21);
      iVar6 = 1;
      if (local_38 < uVar1) {
        iVar5 = JS_ThrowTypeErrorOrFalse(ctx,flags,"not configurable");
        return iVar5;
      }
    }
    else {
      uVar1 = (p->u).array.count;
      dVar18 = (double)(ulong)local_38;
      if (local_38 < uVar1) {
        uVar14 = (long)(int)local_38 << 4 | 8;
        dVar9 = dVar18;
        do {
          ppJVar2 = (p->u).func.var_refs;
          iVar11 = *(int64_t *)((long)ppJVar2 + uVar14);
          if (0xfffffff4 < (uint)iVar11) {
            JVar12 = (JSValueUnion)((JSValueUnion *)((long)ppJVar2 + (uVar14 - 8)))->ptr;
            iVar5 = *JVar12.ptr;
            *(int *)JVar12.ptr = iVar5 + -1;
            if (iVar5 < 2) {
              v.tag = iVar11;
              v.u.ptr = JVar12.ptr;
              __JS_FreeValueRT(ctx->rt,v);
            }
          }
          uVar14 = uVar14 + 0x10;
          uVar15 = SUB84(dVar9,0) + 1;
          dVar9 = (double)(ulong)uVar15;
        } while (uVar15 < uVar1);
        (p->u).array.count = local_38;
      }
      dVar9 = (double)(long)dVar18;
      if (-1 < (int)local_38) {
        dVar9 = dVar18;
      }
      iVar11 = 7;
      if (-1 < (int)local_38) {
        iVar11 = 0;
      }
      pJVar3 = p->prop;
      *(double *)&pJVar3->u = dVar9;
      (pJVar3->u).value.tag = iVar11;
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

static int set_array_length(JSContext *ctx, JSObject *p, JSValue val,
                            int flags)
{
    uint32_t len, idx, cur_len;
    int i, ret;

    /* Note: this call can reallocate the properties of 'p' */
    ret = JS_ToArrayLengthFree(ctx, &len, val, FALSE);
    if (ret)
        return -1;
    /* JS_ToArrayLengthFree() must be done before the read-only test */
    if (unlikely(!(p->shape->prop[0].flags & JS_PROP_WRITABLE)))
        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);

    if (likely(p->fast_array)) {
        uint32_t old_len = p->u.array.count;
        if (len < old_len) {
            for(i = len; i < old_len; i++) {
                JS_FreeValue(ctx, p->u.array.u.values[i]);
            }
            p->u.array.count = len;
        }
        p->prop[0].u.value = JS_NewUint32(ctx, len);
    } else {
        /* Note: length is always a uint32 because the object is an
           array */
        JS_ToUint32(ctx, &cur_len, p->prop[0].u.value);
        if (len < cur_len) {
            uint32_t d;
            JSShape *sh;
            JSShapeProperty *pr;

            d = cur_len - len;
            sh = p->shape;
            if (d <= sh->prop_count) {
                JSAtom atom;

                /* faster to iterate */
                while (cur_len > len) {
                    atom = JS_NewAtomUInt32(ctx, cur_len - 1);
                    ret = delete_property(ctx, p, atom);
                    JS_FreeAtom(ctx, atom);
                    if (unlikely(!ret)) {
                        /* unlikely case: property is not
                           configurable */
                        break;
                    }
                    cur_len--;
                }
            } else {
                /* faster to iterate thru all the properties. Need two
                   passes in case one of the property is not
                   configurable */
                cur_len = len;
                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len &&
                            !(pr->flags & JS_PROP_CONFIGURABLE)) {
                            cur_len = idx + 1;
                        }
                    }
                }

                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len) {
                            /* remove the property */
                            delete_property(ctx, p, pr->atom);
                            /* WARNING: the shape may have been modified */
                            sh = p->shape;
                            pr = get_shape_prop(sh) + i;
                        }
                    }
                }
            }
        } else {
            cur_len = len;
        }
        set_value(ctx, &p->prop[0].u.value, JS_NewUint32(ctx, cur_len));
        if (unlikely(cur_len > len)) {
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "not configurable");
        }
    }
    return TRUE;
}